

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O0

LPVOID SHMPtrToPtr(SHMPTR shmptr)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  int offset;
  int segment;
  void *retval;
  SHMPTR shmptr_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (shmptr == 0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    shmptr_local = 0;
  }
  else {
    uVar1 = (uint)(shmptr >> 0x18) & 0xff;
    if (shm_numsegments <= (int)uVar1) {
      if (!PAL_InitializeChakraCoreCalled) {
        abort();
      }
      SHMMapUnknownSegments();
      if (shm_numsegments <= (int)uVar1) {
        fprintf(_stderr,"] %s %s:%d","SHMPtrToPtr",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
                ,0x349);
        fprintf(_stderr,"Segment %d still unknown; returning NULL\n",(ulong)uVar1);
        return (LPVOID)0x0;
      }
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
    }
    uVar2 = (uint)shmptr & 0xffffff;
    if (uVar2 < 0x40000) {
      if ((shmptr & 0xff000000) == 0) {
        if (uVar2 < 0xc0) {
          fprintf(_stderr,"] %s %s:%d","SHMPtrToPtr",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
                  ,0x35e);
          fprintf(_stderr,"Offset %d is in segment header! returning NULL\n",(ulong)uVar2);
          return (LPVOID)0x0;
        }
      }
      else if (uVar2 < 0x40) {
        fprintf(_stderr,"] %s %s:%d","SHMPtrToPtr",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
                ,0x366);
        fprintf(_stderr,"Offset %d is in segment header! returning NULL\n",(ulong)uVar2);
        return (LPVOID)0x0;
      }
      pvVar3 = Volatile::operator_cast_to_void_((Volatile *)(shm_segment_bases + (int)uVar1));
      shmptr_local = (long)pvVar3 + (long)(int)uVar2;
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
    }
    else {
      fprintf(_stderr,"] %s %s:%d","SHMPtrToPtr",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
              ,0x354);
      fprintf(_stderr,"Offset %d is larger than segment size (%d)! returning NULL\n",(ulong)uVar2,
              0x40000);
      shmptr_local = 0;
    }
  }
  return (LPVOID)shmptr_local;
}

Assistant:

LPVOID SHMPtrToPtr(SHMPTR shmptr)
{
    void *retval;
    int segment;
    int offset;

    TRACE("Converting SHMPTR 0x%08x to a valid pointer...\n", shmptr);
    if(!shmptr)
    {
        WARN("Got SHMPTR \"0\"; returning NULL pointer\n");
        return NULL;
    }

    segment = SHMPTR_SEGMENT(shmptr);

    /* If segment isn't known, it may have been added by another process. We
       need to map all new segments into our address space. */
    if(segment>= shm_numsegments)
    {
        TRACE("SHMPTR is in segment %d, we know only %d. We must now map all "
              "unknowns.\n", segment, shm_numsegments);
        SHMMapUnknownSegments();

        /* if segment is still unknown, then it doesn't exist */
        if(segment>=shm_numsegments)
        {
            ASSERT("Segment %d still unknown; returning NULL\n", segment);
            return NULL;
        }
        TRACE("Segment %d found; continuing\n", segment);
    }

    /* Make sure the offset doesn't point outside the segment */
    offset = SHMPTR_OFFSET(shmptr);
    if(offset>=segment_size)
    {
        ASSERT("Offset %d is larger than segment size (%d)! returning NULL\n",
              offset, segment_size);
        return NULL;

    }

    /* Make sure the offset doesn't point in the segment's header */
    if(segment == 0)
    {
        if (static_cast<size_t>(offset) < roundup(sizeof(SHM_FIRST_HEADER), sizeof(INT64)))
        {
            ASSERT("Offset %d is in segment header! returning NULL\n", offset);
            return NULL;
        }
    }
    else
    {
        if (static_cast<size_t>(offset) < sizeof(SHM_SEGMENT_HEADER))
        {
            ASSERT("Offset %d is in segment header! returning NULL\n", offset);
            return NULL;
        }
    }

    retval = shm_segment_bases[segment];
    retval = static_cast<BYTE*>(retval) + offset;

    TRACE("SHMPTR %#x is at offset %d in segment %d; maps to address %p\n",
          shmptr, offset, segment, retval);
    return retval;
}